

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putil.cpp
# Opt level: O2

char * searchForTZFile(char *path,DefaultTZInfo *tzInfo)

{
  int iVar1;
  int iVar2;
  DIR *__dirp;
  CharString *pCVar3;
  dirent *pdVar4;
  DIR *__dirp_00;
  char *pcVar5;
  FILE *pFVar6;
  long lVar7;
  ulong uVar8;
  size_t sVar9;
  int iVar10;
  char *pcVar11;
  bool bVar12;
  UErrorCode status;
  FILE *local_2c8;
  char *local_2c0;
  CharString newpath;
  CharString curpath;
  char *zoneid;
  
  status = U_ZERO_ERROR;
  pcVar5 = path;
  icu_63::CharString::CharString(&curpath,path,-1,&status);
  if ((U_ZERO_ERROR < status) || (__dirp = opendir(path), __dirp == (DIR *)0x0)) {
    pcVar5 = (char *)0x0;
    goto LAB_0010bf70;
  }
  if (gSearchTZFileResult == (CharString *)0x0) {
    pCVar3 = (CharString *)icu_63::UMemory::operator_new((UMemory *)0x40,(size_t)pcVar5);
    if (pCVar3 != (CharString *)0x0) {
      icu_63::MaybeStackArray<char,_40>::MaybeStackArray((MaybeStackArray<char,_40> *)pCVar3);
      pCVar3->len = 0;
      *(pCVar3->buffer).ptr = '\0';
      gSearchTZFileResult = pCVar3;
      ucln_common_registerCleanup_63(UCLN_COMMON_PUTIL,putil_cleanup);
      goto LAB_0010bc6c;
    }
    gSearchTZFileResult = (CharString *)0x0;
    pcVar5 = (char *)0x0;
  }
  else {
LAB_0010bc6c:
    pcVar5 = (char *)0x0;
    do {
      do {
        pdVar4 = readdir(__dirp);
        if (pdVar4 == (dirent *)0x0) goto LAB_0010bf68;
      } while ((pdVar4->d_name[0] == '.') &&
              ((pdVar4->d_name[1] == '\0' ||
               ((pdVar4->d_name[1] == '.' && (pdVar4->d_name[2] == '\0'))))));
      icu_63::CharString::CharString(&newpath,&curpath,&status);
      pcVar11 = pdVar4->d_name;
      icu_63::CharString::append(&newpath,pcVar11,-1,&status);
      if (status < U_ILLEGAL_ARGUMENT_ERROR) {
        __dirp_00 = opendir(newpath.buffer.ptr);
        if (__dirp_00 == (DIR *)0x0) {
          iVar1 = strcmp("posixrules",pcVar11);
          bVar12 = true;
          if ((iVar1 != 0) &&
             (iVar1 = strcmp("localtime",pcVar11), pcVar11 = newpath.buffer.ptr, iVar1 != 0)) {
            if (tzInfo->defaultTZFilePtr == (FILE *)0x0) {
              pFVar6 = fopen("/etc/localtime","r");
              tzInfo->defaultTZFilePtr = (FILE *)pFVar6;
            }
            local_2c8 = fopen(pcVar11,"r");
            tzInfo->defaultTZPosition = 0;
            if (local_2c8 == (FILE *)0x0) {
              bVar12 = true;
            }
            else {
              local_2c0 = pcVar5;
              if ((FILE *)tzInfo->defaultTZFilePtr != (FILE *)0x0) {
                if (tzInfo->defaultTZFileSize == 0) {
                  fseek((FILE *)tzInfo->defaultTZFilePtr,0,2);
                  lVar7 = ftell((FILE *)tzInfo->defaultTZFilePtr);
                  tzInfo->defaultTZFileSize = lVar7;
                }
                pFVar6 = local_2c8;
                fseek(local_2c8,0,2);
                uVar8 = ftell(pFVar6);
                if (uVar8 == tzInfo->defaultTZFileSize) {
                  if (tzInfo->defaultTZBuffer == (char *)0x0) {
                    rewind((FILE *)tzInfo->defaultTZFilePtr);
                    pcVar5 = (char *)uprv_malloc_63(tzInfo->defaultTZFileSize);
                    tzInfo->defaultTZBuffer = pcVar5;
                    fread(pcVar5,1,tzInfo->defaultTZFileSize,(FILE *)tzInfo->defaultTZFilePtr);
                  }
                  rewind(local_2c8);
                  for (; 0 < (long)uVar8; uVar8 = uVar8 - (long)iVar10) {
                    memset(&zoneid,0,0x200);
                    sVar9 = 0x200;
                    if (uVar8 < 0x200) {
                      sVar9 = uVar8;
                    }
                    sVar9 = fread(&zoneid,1,sVar9,local_2c8);
                    iVar1 = tzInfo->defaultTZPosition;
                    iVar10 = (int)sVar9;
                    iVar2 = bcmp(tzInfo->defaultTZBuffer + iVar1,&zoneid,(long)iVar10);
                    if (iVar2 != 0) goto LAB_0010bebd;
                    tzInfo->defaultTZPosition = iVar10 + iVar1;
                  }
                  fclose(local_2c8);
                  iVar1 = newpath.len;
                  if (0x13 < newpath.len) {
                    iVar1 = 0x14;
                  }
                  zoneid = newpath.buffer.ptr + iVar1;
                  skipZoneIDPrefix(&zoneid);
                  pCVar3 = gSearchTZFileResult;
                  gSearchTZFileResult->len = 0;
                  *(pCVar3->buffer).ptr = '\0';
                  icu_63::CharString::append(pCVar3,zoneid,-1,&status);
                  pcVar5 = local_2c0;
                  if (status < U_ILLEGAL_ARGUMENT_ERROR) {
                    pcVar5 = (gSearchTZFileResult->buffer).ptr;
                  }
                  goto LAB_0010bcd5;
                }
              }
LAB_0010bebd:
              fclose(local_2c8);
              bVar12 = true;
              pcVar5 = local_2c0;
            }
          }
        }
        else {
          closedir(__dirp_00);
          icu_63::CharString::append(&newpath,'/',&status);
          if (U_ZERO_ERROR < status) goto LAB_0010bcd5;
          pcVar5 = searchForTZFile(newpath.buffer.ptr,tzInfo);
          bVar12 = pcVar5 == (char *)0x0;
        }
      }
      else {
LAB_0010bcd5:
        bVar12 = false;
      }
      icu_63::MaybeStackArray<char,_40>::~MaybeStackArray(&newpath.buffer);
    } while (bVar12);
  }
LAB_0010bf68:
  closedir(__dirp);
LAB_0010bf70:
  icu_63::MaybeStackArray<char,_40>::~MaybeStackArray(&curpath.buffer);
  return pcVar5;
}

Assistant:

static char* searchForTZFile(const char* path, DefaultTZInfo* tzInfo) {
    DIR* dirp = NULL;
    struct dirent* dirEntry = NULL;
    char* result = NULL;
    UErrorCode status = U_ZERO_ERROR;

    /* Save the current path */
    CharString curpath(path, -1, status);
    if (U_FAILURE(status)) {
        goto cleanupAndReturn;
    }

    dirp = opendir(path);
    if (dirp == NULL) {
        goto cleanupAndReturn;
    }

    if (gSearchTZFileResult == NULL) {
        gSearchTZFileResult = new CharString;
        if (gSearchTZFileResult == NULL) {
            goto cleanupAndReturn;
        }
        ucln_common_registerCleanup(UCLN_COMMON_PUTIL, putil_cleanup);
    }

    /* Check each entry in the directory. */
    while((dirEntry = readdir(dirp)) != NULL) {
        const char* dirName = dirEntry->d_name;
        if (uprv_strcmp(dirName, SKIP1) != 0 && uprv_strcmp(dirName, SKIP2) != 0) {
            /* Create a newpath with the new entry to test each entry in the directory. */
            CharString newpath(curpath, status);
            newpath.append(dirName, -1, status);
            if (U_FAILURE(status)) {
                break;
            }

            DIR* subDirp = NULL;
            if ((subDirp = opendir(newpath.data())) != NULL) {
                /* If this new path is a directory, make a recursive call with the newpath. */
                closedir(subDirp);
                newpath.append('/', status);
                if (U_FAILURE(status)) {
                    break;
                }
                result = searchForTZFile(newpath.data(), tzInfo);
                /*
                 Have to get out here. Otherwise, we'd keep looking
                 and return the first match in the top-level directory
                 if there's a match in the top-level. If not, this function
                 would return NULL and set gTimeZoneBufferPtr to NULL in initDefault().
                 It worked without this in most cases because we have a fallback of calling
                 localtime_r to figure out the default timezone.
                */
                if (result != NULL)
                    break;
            } else if (uprv_strcmp(TZFILE_SKIP, dirName) != 0 && uprv_strcmp(TZFILE_SKIP2, dirName) != 0) {
                if(compareBinaryFiles(TZDEFAULT, newpath.data(), tzInfo)) {
                    int32_t amountToSkip = sizeof(TZZONEINFO) - 1;
                    if (amountToSkip > newpath.length()) {
                        amountToSkip = newpath.length();
                    }
                    const char* zoneid = newpath.data() + amountToSkip;
                    skipZoneIDPrefix(&zoneid);
                    gSearchTZFileResult->clear();
                    gSearchTZFileResult->append(zoneid, -1, status);
                    if (U_FAILURE(status)) {
                        break;
                    }
                    result = gSearchTZFileResult->data();
                    /* Get out after the first one found. */
                    break;
                }
            }
        }
    }

  cleanupAndReturn:
    if (dirp) {
        closedir(dirp);
    }
    return result;
}